

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlAttrPtr xmlHasProp(xmlNode *node,xmlChar *name)

{
  xmlAttrPtr pxVar1;
  _xmlDoc *p_Var2;
  int iVar3;
  xmlAttributePtr pxVar4;
  _xmlAttr **pp_Var5;
  
  if (node != (xmlNode *)0x0) {
    if (name == (xmlChar *)0x0) {
      return (xmlAttrPtr)0x0;
    }
    if (node->type != XML_ELEMENT_NODE) {
      return (xmlAttrPtr)0x0;
    }
    pp_Var5 = &node->properties;
    while (pxVar1 = *pp_Var5, pxVar1 != (xmlAttrPtr)0x0) {
      iVar3 = xmlStrEqual(pxVar1->name,name);
      if (iVar3 != 0) {
        return pxVar1;
      }
      pp_Var5 = &pxVar1->next;
    }
    p_Var2 = node->doc;
    if ((((p_Var2 != (_xmlDoc *)0x0) && (p_Var2->intSubset != (xmlDtdPtr)0x0)) &&
        ((pxVar4 = xmlGetDtdAttrDesc(p_Var2->intSubset,node->name,name),
         pxVar4 != (xmlAttributePtr)0x0 ||
         ((p_Var2->extSubset != (xmlDtdPtr)0x0 &&
          (pxVar4 = xmlGetDtdAttrDesc(p_Var2->extSubset,node->name,name),
          pxVar4 != (xmlAttributePtr)0x0)))))) && (pxVar4->defaultValue != (xmlChar *)0x0)) {
      return (xmlAttrPtr)pxVar4;
    }
  }
  return (xmlAttrPtr)0x0;
}

Assistant:

xmlAttrPtr
xmlHasProp(const xmlNode *node, const xmlChar *name) {
    xmlAttrPtr prop;
    xmlDocPtr doc;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE) || (name == NULL))
        return(NULL);
    /*
     * Check on the properties attached to the node
     */
    prop = node->properties;
    while (prop != NULL) {
        if (xmlStrEqual(prop->name, name))  {
	    return(prop);
        }
	prop = prop->next;
    }

    /*
     * Check if there is a default declaration in the internal
     * or external subsets
     */
    doc =  node->doc;
    if (doc != NULL) {
        xmlAttributePtr attrDecl;
        if (doc->intSubset != NULL) {
	    attrDecl = xmlGetDtdAttrDesc(doc->intSubset, node->name, name);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdAttrDesc(doc->extSubset, node->name, name);
            if ((attrDecl != NULL) && (attrDecl->defaultValue != NULL))
              /* return attribute declaration only if a default value is given
                 (that includes #FIXED declarations) */
		return((xmlAttrPtr) attrDecl);
	}
    }
    return(NULL);
}